

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_swift.cpp
# Opt level: O0

void __thiscall
flatbuffers::swift::SwiftGenerator::GenObjectHeader(SwiftGenerator *this,StructDef *struct_def)

{
  char *__s;
  long lVar1;
  allocator<char> local_351;
  string local_350;
  allocator<char> local_329;
  string local_328;
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  allocator<char> local_2b1;
  string local_2b0;
  allocator<char> local_289;
  string local_288;
  allocator<char> local_261;
  string local_260;
  allocator<char> local_239;
  string local_238;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  byte local_152;
  allocator<char> local_151;
  string local_150;
  allocator<char> local_129;
  string local_128;
  allocator<char> local_101;
  string local_100;
  allocator<char> local_d9;
  string local_d8;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  string local_70;
  allocator<char> local_39;
  string local_38;
  StructDef *local_18;
  StructDef *struct_def_local;
  SwiftGenerator *this_local;
  
  local_18 = struct_def;
  struct_def_local = (StructDef *)this;
  GenComment(this,&(struct_def->super_Definition).doc_comment);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"SHORT_STRUCTNAME",&local_39);
  IdlNamer::Type_abi_cxx11_(&local_70,&this->namer_,local_18);
  CodeWriter::SetValue(&this->code_,&local_38,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator(&local_39);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"STRUCTNAME",&local_91);
  IdlNamer::NamespacedType_abi_cxx11_(&local_b8,&this->namer_,&local_18->super_Definition);
  CodeWriter::SetValue(&this->code_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"OBJECTTYPE",&local_d9);
  __s = "Table";
  if ((local_18->fixed & 1U) != 0) {
    __s = "Struct";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,__s,&local_101);
  CodeWriter::SetValue(&this->code_,&local_d8,&local_100);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"MUTABLE",&local_129);
  local_152 = 0;
  if ((local_18->fixed & 1U) == 0) {
    std::allocator<char>::allocator();
    local_152 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_150,"",&local_151);
  }
  else {
    Mutable_abi_cxx11_(&local_150,this);
  }
  CodeWriter::SetValue(&this->code_,&local_128,&local_150);
  std::__cxx11::string::~string((string *)&local_150);
  if ((local_152 & 1) != 0) {
    std::allocator<char>::~allocator(&local_151);
  }
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_178,
             "{{ACCESS_TYPE}} struct {{STRUCTNAME}}{{MUTABLE}}: FlatBufferObject\\",&local_179);
  CodeWriter::operator+=(&this->code_,&local_178);
  std::__cxx11::string::~string((string *)&local_178);
  std::allocator<char>::~allocator(&local_179);
  if ((local_18->fixed & 1U) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1a0,", Verifiable\\",&local_1a1);
    CodeWriter::operator+=(&this->code_,&local_1a0);
    std::__cxx11::string::~string((string *)&local_1a0);
    std::allocator<char>::~allocator(&local_1a1);
  }
  if (((local_18->fixed & 1U) == 0) &&
     (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0)) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,", ObjectAPIPacker\\",&local_1c9);
    CodeWriter::operator+=(&this->code_,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::allocator<char>::~allocator(&local_1c9);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0," {\n",&local_1f1);
  CodeWriter::operator+=(&this->code_,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  Indent(this);
  ValidateFunc_abi_cxx11_(&local_218,this);
  CodeWriter::operator+=(&this->code_,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_238,
             "{{ACCESS_TYPE}} var __buffer: ByteBuffer! { return {{ACCESS}}.bb }",&local_239);
  CodeWriter::operator+=(&this->code_,&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::allocator<char>::~allocator(&local_239);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"private var {{ACCESS}}: {{OBJECTTYPE}}\n",&local_261);
  CodeWriter::operator+=(&this->code_,&local_260);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  if ((local_18->fixed & 1U) == 0) {
    lVar1 = std::__cxx11::string::length();
    if (lVar1 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"FILENAME",&local_289)
      ;
      CodeWriter::SetValue
                (&this->code_,&local_288,&((this->super_BaseGenerator).parser_)->file_identifier_);
      std::__cxx11::string::~string((string *)&local_288);
      std::allocator<char>::~allocator(&local_289);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2b0,"{{ACCESS_TYPE}} static var id: String { \"{{FILENAME}}\" } ",
                 &local_2b1);
      CodeWriter::operator+=(&this->code_,&local_2b0);
      std::__cxx11::string::~string((string *)&local_2b0);
      std::allocator<char>::~allocator(&local_2b1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,
                 "{{ACCESS_TYPE}} static func finish(_ fbb: inout FlatBufferBuilder, end: Offset, prefix: Bool = false) { fbb.finish(offset: end, fileId: {{STRUCTNAME}}.id, addPrefix: prefix) }"
                 ,&local_2d9);
      CodeWriter::operator+=(&this->code_,&local_2d8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"private init(_ t: Table) { {{ACCESS}} = t }",&local_301);
    CodeWriter::operator+=(&this->code_,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::allocator<char>::~allocator(&local_301);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_328,
             "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) { {{ACCESS}} = {{OBJECTTYPE}}(bb: bb, position: o) }"
             ,&local_329);
  CodeWriter::operator+=(&this->code_,&local_328);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_350,"",&local_351);
  CodeWriter::operator+=(&this->code_,&local_350);
  std::__cxx11::string::~string((string *)&local_350);
  std::allocator<char>::~allocator(&local_351);
  return;
}

Assistant:

void GenObjectHeader(const StructDef &struct_def) {
    GenComment(struct_def.doc_comment);

    code_.SetValue("SHORT_STRUCTNAME", namer_.Type(struct_def));
    code_.SetValue("STRUCTNAME", namer_.NamespacedType(struct_def));
    code_.SetValue("OBJECTTYPE", struct_def.fixed ? "Struct" : "Table");
    code_.SetValue("MUTABLE", struct_def.fixed ? Mutable() : "");
    code_ +=
        "{{ACCESS_TYPE}} struct {{STRUCTNAME}}{{MUTABLE}}: FlatBufferObject\\";
    if (!struct_def.fixed) code_ += ", Verifiable\\";
    if (!struct_def.fixed && parser_.opts.generate_object_based_api)
      code_ += ", ObjectAPIPacker\\";
    code_ += " {\n";
    Indent();
    code_ += ValidateFunc();
    code_ +=
        "{{ACCESS_TYPE}} var __buffer: ByteBuffer! { return {{ACCESS}}.bb }";
    code_ += "private var {{ACCESS}}: {{OBJECTTYPE}}\n";
    if (!struct_def.fixed) {
      if (parser_.file_identifier_.length()) {
        code_.SetValue("FILENAME", parser_.file_identifier_);
        code_ += "{{ACCESS_TYPE}} static var id: String { \"{{FILENAME}}\" } ";
        code_ +=
            "{{ACCESS_TYPE}} static func finish(_ fbb: inout "
            "FlatBufferBuilder, end: "
            "Offset, prefix: Bool = false) { fbb.finish(offset: end, "
            "fileId: "
            "{{STRUCTNAME}}.id, addPrefix: prefix) }";
      }
      code_ += "private init(_ t: Table) { {{ACCESS}} = t }";
    }
    code_ +=
        "{{ACCESS_TYPE}} init(_ bb: ByteBuffer, o: Int32) { {{ACCESS}} = "
        "{{OBJECTTYPE}}(bb: "
        "bb, position: o) }";
    code_ += "";
  }